

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGrid.cpp
# Opt level: O2

void __thiscall PatternGrid::mousePressEvent(PatternGrid *this,QMouseEvent *evt)

{
  bool bVar1;
  int iVar2;
  SelectType SVar3;
  QPoint QVar4;
  PatternCursorBase PVar5;
  PatternAnchor cursor;
  PatternSelection selection;
  PatternSelection local_50;
  Iterator local_38;
  
  if (*(int *)(evt + 0x40) == 1) {
    QVar4 = QMouseEvent::pos(evt);
    this->mMousePos = QVar4;
    iVar2 = PatternLayout::patternStart(&this->mLayout);
    if (QVar4.xp < iVar2) {
      PatternModel::deselect(this->mModel);
      iVar2 = mouseToRow(this,(this->mMousePos).yp);
      bVar1 = rowIsValid(this,iVar2);
      if (bVar1) {
        this->mMouseOp = selectingRows;
        PatternModel::selectRow(this->mModel,iVar2);
        return;
      }
    }
    else {
      PVar5 = (PatternCursorBase)mouseToCursor(this,this->mMousePos);
      cursor.super_PatternCursorBase.track = PVar5.track;
      iVar2 = PVar5.row;
      if (((cursor.super_PatternCursorBase.track < 4 && -1 < iVar2) && (uint)PVar5.column >> 2 < 3)
         && (bVar1 = rowIsValid(this,iVar2), bVar1)) {
        (this->mSelectionStart).super_PatternCursorBase = PVar5;
        bVar1 = PatternModel::hasSelection(this->mModel);
        if (bVar1) {
          PatternModel::selection(this->mModel);
          SVar3 = PatternAnchor::selectColumn(PVar5.column);
          cursor.super_PatternCursorBase._0_8_ = CONCAT44(SVar3,iVar2) & 0xffffffff7fffffff;
          bVar1 = PatternSelection::contains(&local_50,cursor);
          if (bVar1) {
            this->mMouseOp = dragging;
            PatternSelection::iterator(&local_38,&local_50);
            this->mDragRow = iVar2 - local_38.mStart.super_PatternCursorBase.row;
            return;
          }
        }
        PatternModel::deselect(this->mModel);
        this->mMouseOp = beginSelecting;
      }
    }
  }
  return;
}

Assistant:

void PatternGrid::mousePressEvent(QMouseEvent *evt) {
    if (evt->button() == Qt::LeftButton) {

        mMousePos = evt->pos();

        if (mMousePos.x() < mLayout.patternStart()) {
            // select whole rows instead of cells
            mModel.deselect();
            int row = mouseToRow(mMousePos.y());
            if (rowIsValid(row)) {
                mMouseOp = MouseOperation::selectingRows;
                mModel.selectRow(row);
            }
        } else {
            // now convert the mouse coordinates to a coordinate on the grid
            auto cursor = mouseToCursor(mMousePos);
            if (cursor.isValid() && rowIsValid(cursor.row)) {
                mSelectionStart = cursor;

                if (mModel.hasSelection()) {
                    // check if the mouse is within the selection rectangle
                    auto selection = mModel.selection();
                    if (selection.contains(cursor)) {
                        mMouseOp = MouseOperation::dragging;
                        mDragRow = cursor.row - selection.iterator().rowStart();
                        return;
                    }
                }

                mModel.deselect();
                mMouseOp = MouseOperation::beginSelecting;

            }
        }

    }
}